

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  int iVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  SQInteger SVar4;
  undefined8 *in_RCX;
  long *in_RDX;
  long in_RSI;
  HSQUIRRELVM in_RDI;
  SQChar *prec;
  SQChar f;
  SQInteger fpos;
  size_t flen;
  SQFloat tf;
  SQInteger ti;
  SQChar *ts;
  SQInteger valtype;
  SQInteger addlen;
  SQInteger w;
  SQInteger nparam;
  SQInteger i;
  SQInteger n;
  SQInteger allocated;
  SQInteger format_size;
  SQChar fmt [20];
  SQChar *dest;
  SQChar *format;
  SQChar **in_stack_ffffffffffffff18;
  HSQUIRRELVM in_stack_ffffffffffffff20;
  HSQUIRRELVM in_stack_ffffffffffffff28;
  HSQUIRRELVM v_00;
  char *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  char in_stack_ffffffffffffff3f;
  SQChar *in_stack_ffffffffffffff40;
  SQChar *pSVar5;
  SQChar *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  HSQUIRRELVM in_stack_ffffffffffffff58;
  SQChar **local_98;
  long local_90;
  HSQUIRRELVM local_80;
  long local_78;
  long local_70;
  size_t local_68;
  undefined8 local_60;
  char local_58;
  SQChar aSStack_57 [31];
  SQChar *local_38;
  long local_30;
  undefined8 *local_28;
  long *local_20;
  long local_18;
  HSQUIRRELVM local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sq_getstring(in_stack_ffffffffffffff28,(SQInteger)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
  local_60 = sq_getsize(in_stack_ffffffffffffff28,(SQInteger)in_stack_ffffffffffffff20);
  local_68 = local_60 + 2;
  local_38 = sq_getscratchpad(in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  local_70 = 0;
  local_78 = 0;
  local_80 = (HSQUIRRELVM)(local_18 + 1);
  while( true ) {
    while( true ) {
      while( true ) {
        if (local_60 <= local_70) {
          *local_20 = local_78;
          local_38[local_78] = '\0';
          *local_28 = local_38;
          return 0;
        }
        if (*(char *)(local_30 + local_70) == '%') break;
        local_38[local_78] = *(SQChar *)(local_30 + local_70);
        local_70 = local_70 + 1;
        local_78 = local_78 + 1;
      }
      if (*(char *)(local_30 + 1 + local_70) != '%') break;
      local_38[local_78] = '%';
      local_70 = local_70 + 2;
      local_78 = local_78 + 1;
    }
    v_00 = local_80;
    SVar2 = sq_gettop(local_10);
    if (SVar2 < (long)v_00) break;
    SVar2 = validate_format(in_stack_ffffffffffffff58,
                            (SQChar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff48,(SQInteger)in_stack_ffffffffffffff40,
                            (SQInteger *)
                            CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (SVar2 < 0) {
      return -1;
    }
    in_stack_ffffffffffffff58 = (HSQUIRRELVM)0x0;
    in_stack_ffffffffffffff54 = 0.0;
    in_stack_ffffffffffffff20 = (HSQUIRRELVM)(ulong)((int)*(char *)(local_30 + SVar2) - 0x45);
    switch(in_stack_ffffffffffffff20) {
    case (HSQUIRRELVM)0x0:
    case (HSQUIRRELVM)0x2:
    case (HSQUIRRELVM)0x20:
    case (HSQUIRRELVM)0x21:
    case (HSQUIRRELVM)0x22:
      SVar3 = sq_getfloat((HSQUIRRELVM)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                          ,(SQInteger)in_stack_ffffffffffffff30,(SQFloat *)v_00);
      if (SVar3 < 0) {
        SVar3 = sq_throwerror(in_stack_ffffffffffffff20,(SQChar *)in_stack_ffffffffffffff18);
        return SVar3;
      }
      local_90 = 0x65;
      local_98 = (SQChar **)0x66;
      break;
    default:
      SVar3 = sq_throwerror(in_stack_ffffffffffffff20,(SQChar *)in_stack_ffffffffffffff18);
      return SVar3;
    case (HSQUIRRELVM)0x13:
    case (HSQUIRRELVM)0x1f:
    case (HSQUIRRELVM)0x24:
    case (HSQUIRRELVM)0x2a:
    case (HSQUIRRELVM)0x30:
    case (HSQUIRRELVM)0x33:
      in_stack_ffffffffffffff48 = (SQChar *)strlen(&local_58);
      in_stack_ffffffffffffff3f = (&local_58)[(long)(in_stack_ffffffffffffff48 + -1)];
      pSVar5 = in_stack_ffffffffffffff48 + -1;
      for (in_stack_ffffffffffffff30 = "ll"; *in_stack_ffffffffffffff30 != '\0';
          in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 + 1) {
        (&local_58)[(long)pSVar5] = *in_stack_ffffffffffffff30;
        pSVar5 = pSVar5 + 1;
      }
      (&local_58)[(long)pSVar5] = in_stack_ffffffffffffff3f;
      in_stack_ffffffffffffff40 = pSVar5 + 2;
      (pSVar5 + -0x57)[(long)&stack0x00000000] = '\0';
    case (HSQUIRRELVM)0x1e:
      SVar3 = sq_getinteger((HSQUIRRELVM)
                            CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                            (SQInteger)in_stack_ffffffffffffff30,(SQInteger *)v_00);
      if (SVar3 < 0) {
        SVar3 = sq_throwerror(in_stack_ffffffffffffff20,(SQChar *)in_stack_ffffffffffffff18);
        return SVar3;
      }
      local_90 = 0x65;
      local_98 = (SQChar **)0x69;
      break;
    case (HSQUIRRELVM)0x2e:
      SVar3 = sq_getstring(v_00,(SQInteger)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (SVar3 < 0) {
        SVar3 = sq_throwerror(in_stack_ffffffffffffff20,(SQChar *)in_stack_ffffffffffffff18);
        return SVar3;
      }
      SVar4 = sq_getsize(v_00,(SQInteger)in_stack_ffffffffffffff20);
      local_90 = SVar4 + 1;
      local_98 = (SQChar **)0x73;
    }
    local_70 = SVar2 + 1;
    local_68 = local_90 + 1 + local_68;
    local_38 = sq_getscratchpad(in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
    if (local_98 == (SQChar **)0x66) {
      iVar1 = snprintf(local_38 + local_78,local_68,&local_58,(double)in_stack_ffffffffffffff54);
      local_78 = iVar1 + local_78;
    }
    else if (local_98 == (SQChar **)0x69) {
      iVar1 = snprintf(local_38 + local_78,local_68,&local_58,in_stack_ffffffffffffff58);
      local_78 = iVar1 + local_78;
    }
    else if (local_98 == (SQChar **)0x73) {
      iVar1 = snprintf(local_38 + local_78,local_68,&local_58,0);
      local_78 = iVar1 + local_78;
    }
    local_80 = (HSQUIRRELVM)
               ((long)&(local_80->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1);
    in_stack_ffffffffffffff18 = local_98;
  }
  SVar3 = sq_throwerror(in_stack_ffffffffffffff20,(SQChar *)in_stack_ffffffffffffff18);
  return SVar3;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    sq_getstring(v,nformatstringidx,&format);
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}